

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM_Command.h
# Opt level: O2

shared_ptr<nigel::IM_Constant> __thiscall
nigel::IM_Operator::as<nigel::IM_Constant>(IM_Operator *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<nigel::IM_Constant> sVar1;
  __shared_ptr<nigel::IM_Operator,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__shared_ptr<nigel::IM_Operator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<nigel::IM_Operator,void>
            (local_20,(__weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 8));
  std::static_pointer_cast<nigel::IM_Constant,nigel::IM_Operator>
            ((shared_ptr<nigel::IM_Operator> *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  sVar1.super___shared_ptr<nigel::IM_Constant,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<nigel::IM_Constant,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<nigel::IM_Constant>)
         sVar1.super___shared_ptr<nigel::IM_Constant,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> as()
		{
			return std::static_pointer_cast< T >( shared_from_this() );
		}